

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Document::~Document(Document *this)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  
  for (p_Var2 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->objects)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    p_Var1 = p_Var2[1]._M_parent;
    if (p_Var1 != (_Base_ptr)0x0) {
      std::unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>::
      ~unique_ptr((unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
                   *)&p_Var1->_M_left);
    }
    operator_delete(p_Var1,0x28);
  }
  for (p_Var2 = (this->src_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->src_connections)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    p_Var1 = p_Var2[1]._M_parent;
    if (p_Var1 != (_Base_ptr)0x0) {
      std::__cxx11::string::~string((string *)&p_Var1->_M_parent);
    }
    operator_delete(p_Var1,0x40);
  }
  std::
  unique_ptr<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
  ::~unique_ptr(&this->globals);
  std::
  _Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
  ::~_Vector_base(&(this->animationStacksResolved).
                   super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
                 );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->animationStacks).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::__cxx11::string::~string((string *)&this->creator);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
  ::~_Rb_tree(&(this->dest_connections)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
  ::~_Rb_tree(&(this->src_connections)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>_>_>
  ::~_Rb_tree(&(this->templates)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>,_std::_Select1st<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
  ::~_Rb_tree(&(this->objects)._M_t);
  return;
}

Assistant:

Document::~Document()
{
    for(ObjectMap::value_type& v : objects) {
        delete v.second;
    }

    for(ConnectionMap::value_type& v : src_connections) {
        delete v.second;
    }
    // |dest_connections| contain the same Connection objects as the |src_connections|
}